

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ScopeBegin(Parser *this)

{
  pointer pFVar1;
  pointer pDVar2;
  uint32_t uVar3;
  DebugLineEntry local_10;
  
  pFVar1 = (this->m_variableStackFrame).m_frames.
           super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_variableStackFrame).m_frames.
      super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pFVar1) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_2048UL,_16UL>_>::
    _M_replace(&(this->m_variableStackFrame).m_errorMessage,0,
               (this->m_variableStackFrame).m_errorMessage._M_string_length,
               "Unexpected empty variable frame",0x1f);
    local_10 = (DebugLineEntry)(this->m_variableStackFrame).m_errorMessage._M_dataplus._M_p;
    Error<char_const*>(this,"%s",(char **)&local_10);
  }
  else {
    std::
    vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
    ::emplace_back<>(&pFVar1[-1].stack);
  }
  if (CommonData::globalParams.enableDebugInfo == true) {
    pDVar2 = (this->m_debugLines).
             super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar2) {
      uVar3 = this->m_lastLine;
    }
    else {
      uVar3 = this->m_lastLine;
      if (pDVar2[-1].lineNumber == uVar3) goto LAB_0020c66f;
    }
    local_10.lineNumber = uVar3;
    local_10.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_10);
  }
LAB_0020c66f:
  BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,ScopeBegin);
  return;
}

Assistant:

inline void Parser::ScopeBegin()
	{
		if (!m_variableStackFrame.ScopeBegin())
			Error("%s", m_variableStackFrame.GetErrorMessage());
		EmitOpcode(Opcode::ScopeBegin);
	}